

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O2

void uWS::HTTPSocket<false>::onData(Socket s,char *data,int length)

{
  string *psVar1;
  Data *this;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  Data *this_00;
  size_t i;
  ulong uVar7;
  Socket s_local;
  HTTPSocket<false> httpSocket;
  uv_poll_t *local_90;
  int enable;
  HTTPParser httpParser;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  s_local = s;
  HTTPSocket(&httpSocket,s);
  this = *(Data **)httpSocket.super_Socket.p;
  if ((this->httpBuffer)._M_string_length + (long)length < 0x1401) {
    psVar1 = &this->httpBuffer;
    std::__cxx11::string::append((char *)psVar1,(ulong)data);
    lVar6 = std::__cxx11::string::find((char *)psVar1,0x11864e);
    if (lVar6 != -1) {
      enable = 1;
      setsockopt(*(int *)((long)httpSocket.super_Socket.p + 0x98),6,1,&enable,4);
      std::__cxx11::string::resize((ulong)psVar1);
      HTTPParser::HTTPParser(&httpParser,(this->httpBuffer)._M_dataplus._M_p);
      HTTPParser::operator++(&httpParser,0);
      do {
        if (httpParser.key.second == 7) {
          for (uVar7 = 0; pcVar3 = httpParser.key.first, uVar7 < httpParser.key.second;
              uVar7 = uVar7 + 1) {
            iVar5 = tolower((int)httpParser.key.first[uVar7]);
            pcVar3[uVar7] = (char)iVar5;
          }
          for (uVar7 = 0; pcVar3 = httpParser.value.first, uVar7 < httpParser.value.second;
              uVar7 = uVar7 + 1) {
            iVar5 = tolower((int)httpParser.value.first[uVar7]);
            pcVar3[uVar7] = (char)iVar5;
          }
          iVar5 = strncmp(httpParser.key.first,"upgrade",httpParser.key.second);
          if (iVar5 == 0) {
            iVar5 = strncmp(httpParser.value.first,"websocket",9);
            if (iVar5 == 0) {
              this_00 = (Data *)operator_new(0xa0);
              WebSocket<false>::Data::Data(this_00,false,&this->super_SocketData);
              uS::Socket::enterState<uWS::WebSocket<false>>(&s_local,this_00);
              uS::Socket::cancelTimeout(&httpSocket.super_Socket);
              *(void **)(*(long *)httpSocket.super_Socket.p + 0x10) = this->httpUser;
              Group<false>::addWebSocket(*(s_local.p)->data,s_local.p);
              lVar2 = *(s_local.p)->data;
              local_48 = 0;
              uStack_40 = 0;
              local_58 = 0;
              uStack_50 = 0;
              local_90 = s_local.p;
              if (*(long *)(lVar2 + 0x90) != 0) {
                (**(code **)(lVar2 + 0x98))(lVar2 + 0x80,&local_90,&local_58);
                bVar4 = uS::Socket::isClosed(&s_local);
                if ((!bVar4) && (*(char *)((long)(s_local.p)->data + 0x1c) == '\0')) {
                  WebSocketProtocol<false>::consume
                            ((WebSocketProtocol<false> *)((long)(s_local.p)->data + 0x40),
                             (this->httpBuffer)._M_dataplus._M_p + lVar6 + 4,
                             ((int)(this->httpBuffer)._M_string_length - (int)lVar6) - 0x16,
                             s_local.p);
                }
                Data::~Data(this);
                operator_delete(this);
                return;
              }
              std::__throw_bad_function_call();
            }
            goto LAB_00117288;
          }
        }
        else if (httpParser.key.second == 0) goto LAB_00117288;
        HTTPParser::operator++(&httpParser,0);
      } while( true );
    }
  }
  else {
LAB_00117288:
    onEnd((Socket)0x117290);
  }
  return;
}

Assistant:

void HTTPSocket<isServer>::onData(uS::Socket s, char *data, int length) {
    HTTPSocket httpSocket(s);
    HTTPSocket::Data *httpData = httpSocket.getData();

    // 5k = force close!
    if (httpData->httpBuffer.length() + length > 1024 * 5) {
        httpSocket.onEnd(s);
        return;
    }

    httpData->httpBuffer.append(data, length);

    size_t endOfHTTPBuffer = httpData->httpBuffer.find("\r\n\r\n");
    if (endOfHTTPBuffer != std::string::npos) {

        int enable = 1;
        setsockopt(httpSocket.getFd(), IPPROTO_TCP, TCP_NODELAY, &enable, sizeof(enable));

        if (isServer) {

            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            std::pair<char *, size_t> secKey = {}, extensions = {}, subprotocol = {}, path = httpParser.value;
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 17 || httpParser.key.second == 24 || httpParser.key.second == 22) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "sec-websocket-key", httpParser.key.second)) {
                        secKey = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-extensions", httpParser.key.second)) {
                        extensions = httpParser.value;
                    } else if (!strncmp(httpParser.key.first, "sec-websocket-protocol", httpParser.key.second)) {
                        subprotocol = httpParser.value;
                    }
                }
            }

            if (secKey.first && secKey.second == 24) {

                // this needs to be part of upgrade itself, and shared with Hub::upgrade!
                bool perMessageDeflate = false;
                std::string extensionsResponse;
                if (extensions.first) {
                    Group<isServer> *group = (Group<isServer> *) s.getNodeData(s.getSocketData());
                    ExtensionsNegotiator<uWS::SERVER> extensionsNegotiator(group->extensionOptions);
                    extensionsNegotiator.readOffer(std::string(extensions.first, extensions.second));
                    extensionsResponse = extensionsNegotiator.generateOffer();
                    if (extensionsNegotiator.getNegotiatedOptions() & PERMESSAGE_DEFLATE) {
                        perMessageDeflate = true;
                    }
                }

                if (httpSocket.upgrade(secKey.first, extensionsResponse.data(), extensionsResponse.length(), subprotocol.first, subprotocol.second)) {
                    s.cancelTimeout();
                    s.enterState<WebSocket<SERVER>>(new WebSocket<SERVER>::Data(perMessageDeflate, httpData));

                    ((Group<SERVER> *) s.getSocketData()->nodeData)->addWebSocket(s);
                    //s.cork(true);
                    ((Group<SERVER> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<SERVER>(s), {path.first, subprotocol.first,
                                                                                                              path.second, subprotocol.second});
                    //s.cork(false);
                    delete httpData;
                }
            } else {
                httpSocket.onEnd(s);
            }
        } else {
            httpData->httpBuffer.resize(httpData->httpBuffer.length() + WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING);

            bool isUpgrade = false;
            HTTPParser httpParser = (char *) httpData->httpBuffer.data();
            //std::pair<char *, size_t> secKey = {}, extensions = {};
            for (httpParser++; httpParser.key.second; httpParser++) {
                if (httpParser.key.second == 7) {
                    // lowercase the key
                    for (size_t i = 0; i < httpParser.key.second; i++) {
                        httpParser.key.first[i] = tolower(httpParser.key.first[i]);
                    }
                    // lowercase the value
                    for (size_t i = 0; i < httpParser.value.second; i++) {
                        httpParser.value.first[i] = tolower(httpParser.value.first[i]);
                    }
                    if (!strncmp(httpParser.key.first, "upgrade", httpParser.key.second)) {
                        if (!strncmp(httpParser.value.first, "websocket", 9)) {
                            isUpgrade = true;
                        }
                        break;
                    }
                }
            }

            if (isUpgrade) {
                s.enterState<WebSocket<CLIENT>>(new WebSocket<CLIENT>::Data(false, httpData));

                //s.cork(true);
                httpSocket.cancelTimeout();
                httpSocket.setUserData(httpData->httpUser);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->addWebSocket(s);
                ((Group<CLIENT> *) s.getSocketData()->nodeData)->connectionHandler(WebSocket<CLIENT>(s), {nullptr, nullptr, 0, 0});
                //s.cork(false);

                if (!(s.isClosed() || s.isShuttingDown())) {
                    WebSocketProtocol<CLIENT> *kws = (WebSocketProtocol<CLIENT> *) ((WebSocket<CLIENT>::Data *) s.getSocketData());
                    kws->consume((char *) httpData->httpBuffer.data() + endOfHTTPBuffer + 4, httpData->httpBuffer.length() - endOfHTTPBuffer - 4 - WebSocketProtocol<uWS::CLIENT>::CONSUME_POST_PADDING, s);
                }

                delete httpData;
            } else {
                httpSocket.onEnd(s);
            }
        }
    }
}